

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

void __thiscall
VertexAttrib64Bit::LimitTest::getProgramDetails
          (LimitTest *this,_iteration iteration,bool use_arrays,bool use_locations,
          bool use_vertex_attrib_divisor,string *out_varying_name,string *out_vertex_shader_code)

{
  long lVar1;
  char *pcVar2;
  GLint GVar3;
  GLint *pGVar4;
  GLint *pGVar5;
  GLint GVar6;
  GLchar **ppGVar7;
  GLint GVar8;
  ulong uVar9;
  size_t sVar10;
  ostream *poVar11;
  LimitTest *this_00;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  undefined7 in_register_00000081;
  int iVar16;
  ulong uVar17;
  int iVar18;
  GLint attribute;
  int iVar19;
  long lVar20;
  int iVar21;
  attributeConfiguration configuration;
  stringstream stream;
  attributeConfiguration local_208;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_208.m_n_attributes_per_group = 0;
  local_208.m_type_names = (GLchar **)0x0;
  local_208.m_vertex_length = 0;
  local_208.m_n_elements = (GLint *)0x0;
  local_208.m_n_rows = (GLint *)0x0;
  local_208.m_n_types = 0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar12 = "gl_VertexID";
  if ((int)CONCAT71(in_register_00000081,use_vertex_attrib_divisor) != 0) {
    pcVar12 = "gl_InstanceID";
  }
  getVertexArrayConfiguration(this,iteration,&local_208);
  GVar6 = local_208.m_n_types;
  GVar3 = local_208.m_n_attributes_per_group;
  uVar9 = (ulong)(uint)local_208.m_n_types;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "#version 400\n#extension GL_ARB_vertex_attrib_64bit : require\n\nprecision highp float;\n\n"
             ,0x56);
  ppGVar7 = local_208.m_type_names;
  pGVar5 = local_208.m_n_rows;
  pGVar4 = local_208.m_n_elements;
  if (0 < GVar6) {
    iVar21 = 0;
    uVar17 = 0;
    do {
      pcVar2 = ppGVar7[uVar17];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"// ",3);
      iVar14 = (int)(LimitTest *)local_1a8;
      if (pcVar2 == (char *)0x0) {
        std::ios::clear(iVar14 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar10 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar10);
      }
      this_00 = (LimitTest *)local_1a8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      if (use_arrays) {
        if (use_locations) {
          iVar18 = 0;
          if (uVar17 < GVar6 - 1) {
            iVar18 = 0;
            uVar13 = (ulong)(GVar6 - 1);
            do {
              iVar18 = iVar18 + (pGVar4[uVar13] / pGVar5[uVar13]) * GVar3;
              uVar13 = uVar13 - 1;
            } while ((long)uVar17 < (long)uVar13);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"layout(location = ",0x12);
          poVar11 = (ostream *)std::ostream::operator<<((LimitTest *)local_1a8,iVar18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,") ",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
        if (pcVar2 == (char *)0x0) {
          std::ios::clear(iVar14 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
        }
        else {
          sVar10 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," attribute_",0xb);
        poVar11 = (ostream *)std::ostream::operator<<((LimitTest *)local_1a8,(GLint)uVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,GVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"];\n",3);
      }
      else if (0 < GVar3) {
        attribute = 0;
        do {
          if (use_locations) {
            GVar8 = calculateAttributeLocation(this_00,&local_208,attribute,(GLint)uVar17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"layout(location = ",0x12);
            poVar11 = (ostream *)std::ostream::operator<<(local_1a8,GVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,") ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"in ",3);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)(ostream *)local_1a8 +
                            (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
          }
          else {
            sVar10 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," attribute_",0xb)
          ;
          this_00 = (LimitTest *)std::ostream::operator<<((ostream *)local_1a8,iVar21 + attribute);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,";\n",2);
          attribute = attribute + 1;
        } while (GVar3 != attribute);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      uVar17 = uVar17 + 1;
      iVar21 = iVar21 + GVar3;
    } while (uVar17 != uVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"out int ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vs_output_value",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n{\n",0xe);
  ppGVar7 = local_208.m_type_names;
  pGVar4 = local_208.m_n_elements;
  if (0 < GVar6) {
    lVar1 = (ulong)use_vertex_attrib_divisor * 2 + 0xb;
    uVar17 = 0;
    do {
      iVar21 = pGVar4[uVar17];
      pcVar2 = ppGVar7[uVar17];
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"// ",3);
      if (pcVar2 == (char *)0x0) {
        std::ios::clear((int)(ostream *)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar10 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      if (0 < GVar3) {
        iVar14 = (int)uVar17;
        iVar18 = 0;
        do {
          iVar19 = iVar18 + GVar3 * iVar14;
          pcVar15 = "    else if (attribute_";
          if (iVar19 == 0) {
            pcVar15 = "    if (attribute_";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,pcVar15,(ulong)(iVar19 != 0) * 5 + 0x12);
          if (use_arrays) {
            poVar11 = (ostream *)std::ostream::operator<<(local_1a8,iVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
          }
          else {
            std::ostream::operator<<(local_1a8,iVar19);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," != ",4);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
          }
          else {
            sVar10 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
          if (iteration - DMAT2 < 5) {
            if (0 < iVar21) {
              iVar16 = 0;
              do {
                poVar11 = (ostream *)std::ostream::operator<<(local_1a8,iVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," + ",3);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar19);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," + ",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,lVar1);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," * 16 + ",8);
                std::ostream::operator<<(poVar11,iVar16);
                if (iVar16 - iVar21 != -1) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 != iVar21);
            }
          }
          else if (iteration == DOUBLE_DVEC2) {
            if (iVar21 == 1) {
              poVar11 = (ostream *)std::ostream::operator<<(local_1a8,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," + ",3);
              lVar20 = 4;
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,lVar1);
              pcVar15 = " * 2";
            }
            else {
              poVar11 = (ostream *)std::ostream::operator<<(local_1a8,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," + ",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,lVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," * 3 + 1",8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," + ",3);
              lVar20 = 8;
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,lVar1);
              pcVar15 = " * 3 + 2";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,lVar20);
          }
          else if ((iteration == DVEC3_DVEC4) && (0 < iVar21)) {
            iVar16 = 0;
            do {
              poVar11 = (ostream *)std::ostream::operator<<(local_1a8,iVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," + ",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar12,lVar1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," * ",3);
              poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar21);
              std::__ostream_insert<char,std::char_traits<char>>(poVar11," + ",3);
              std::ostream::operator<<(poVar11,iVar16);
              if (iVar21 + -1 != iVar16) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
              }
              iVar16 = iVar16 + 1;
            } while (iVar21 != iVar16);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"))\n",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    {\n",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"        ",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"vs_output_value",0xf);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = 0;\n",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    }\n",6);
          iVar18 = iVar18 + 1;
        } while (iVar18 != GVar3);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    else\n",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    {\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"        ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vs_output_value",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," = 1;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    }\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n\n",3);
  std::__cxx11::string::_M_replace
            ((ulong)out_varying_name,0,(char *)out_varying_name->_M_string_length,0x1a9b718);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_vertex_shader_code,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return;
}

Assistant:

void LimitTest::getProgramDetails(_iteration iteration, bool use_arrays, bool use_locations,
								  bool use_vertex_attrib_divisor, std::string& out_varying_name,
								  std::string& out_vertex_shader_code) const
{
	static const GLchar* varying_name = "vs_output_value";

	attributeConfiguration configuration;
	GLint				   n_attributes = 0;
	GLint				   n_types		= 0;
	std::stringstream	  stream;

	const GLchar* advancement_str = (true == use_vertex_attrib_divisor) ? "gl_InstanceID" : "gl_VertexID";

	getVertexArrayConfiguration(iteration, configuration);

	n_attributes = configuration.m_n_attributes_per_group;
	n_types		 = configuration.m_n_types;

	/* Preamble */
	stream << "#version 400\n"
			  "#extension GL_ARB_vertex_attrib_64bit : require\n"
			  "\n"
			  "precision highp float;\n"
			  "\n";

	/* Attribute declarations */
	/* Spearated attributes are called: attribute_ORDINAL, arrayed: attribute_N_TYPE */
	for (GLint n_type = 0; n_type < n_types; ++n_type)
	{
		const GLint   attribute_offset = n_type * n_attributes;
		const GLchar* type_name		   = configuration.m_type_names[n_type];

		stream << "// " << type_name << "\n";

		if (false == use_arrays)
		{
			for (GLint attribute = 0; attribute < n_attributes; ++attribute)
			{
				if (true == use_locations)
				{
					const GLint location = calculateAttributeLocation(configuration, attribute, n_type);

					stream << "layout(location = " << location << ") ";
				}

				stream << "in " << type_name << " attribute_" << attribute + attribute_offset << ";\n";
			}
		}
		else
		{
			if (true == use_locations)
			{
				const GLint location = calculateAttributeLocation(configuration, m_array_attribute, n_type);

				stream << "layout(location = " << location << ") ";
			}

			stream << "in " << type_name << " attribute_" << n_type << "[" << n_attributes << "];\n";
		}

		stream << "\n";
	}

	/* Varying declaration */
	stream << "out int " << varying_name << ";\n\n";

	/* Main */
	stream << "void main()\n"
			  "{\n";

	for (GLint n_type = 0; n_type < n_types; ++n_type)
	{
		const GLint   n_elements = configuration.m_n_elements[n_type];
		const GLchar* type_name  = configuration.m_type_names[n_type];

		stream << "// " << type_name << "\n";

		/* if (attribute_name != type(values))
		 * {
		 *     varying = 0;
		 * }
		 */
		for (GLint attribute = 0; attribute < n_attributes; ++attribute)
		{
			const GLint attribute_ordinal = attribute + n_type * n_attributes;

			/* First attribute is verified with "if", rest with "else if" */
			if (0 == attribute_ordinal)
			{
				stream << "    if (attribute_";
			}
			else
			{
				stream << "    else if (attribute_";
			}

			/* Spearated attributes are called: attribute_ORDINAL, arrayed: attribute_N_TYPE[INDEX] */
			if (false == use_arrays)
			{
				stream << attribute_ordinal;
			}
			else
			{
				stream << n_type << "[" << attribute << "]";
			}

			/* != type() */
			stream << " != " << type_name << "(";

			/* Values for type constructor, depend on iteration */
			switch (iteration)
			{
			case DOUBLE_DVEC2:

				/* Double attributes should be assigned the value:
				 (n_attribute + gl_VertexID * 2) */
				/* Dvec2 attribute components should be assigned the following
				 vector values:
				 (n_attribute + gl_VertexID * 3 + 1,
				 n_attribute + gl_VertexID * 3 + 2)*/

				if (1 == n_elements)
				{
					stream << attribute_ordinal << " + " << advancement_str << " * 2";
				}
				else
				{
					stream << attribute_ordinal << " + " << advancement_str << " * 3 + 1"
						   << ", " << attribute_ordinal << " + " << advancement_str << " * 3 + 2";
				}

				break;

			case DVEC3_DVEC4:

				/* Dvec3 attribute components should be assigned the following
				 vector values:
				 (n_attribute + gl_VertexID * 3 + 0,
				 n_attribute + gl_VertexID * 3 + 1,
				 n_attribute + gl_VertexID * 3 + 2).

				 Dvec4 attribute components should be assigned the following
				 vector values:
				 (n_attribute + gl_VertexID * 4 + 0,
				 n_attribute + gl_VertexID * 4 + 1,
				 n_attribute + gl_VertexID * 4 + 2,
				 n_attribute + gl_VertexID * 4 + 3).*/

				for (GLint element = 0; element < n_elements; ++element)
				{
					stream << attribute_ordinal << " + " << advancement_str << " * " << n_elements << " + " << element;

					if (n_elements != element + 1)
					{
						stream << ", ";
					}
				}

				break;

			case DMAT2:
			case DMAT3X2_DMAT4X2:
			case DMAT2X3_DMAT2X4:
			case DMAT3_DMAT3X4:
			case DMAT4X3_DMAT4:

				/* Subsequent matrix elements should be assigned the following value:
				 (n_type + n_attribute + gl_VertexID * 16 + n_value)*/

				for (GLint element = 0; element < n_elements; ++element)
				{
					stream << n_type << " + " << attribute_ordinal << " + " << advancement_str << " * 16 + " << element;

					if (n_elements != element + 1)
					{
						stream << ", ";
					}
				}

				break;
			}

			/* type() { varying = 0 } */
			stream << "))\n"
				   << "    {\n"
				   << "        " << varying_name << " = 0;\n"
				   << "    }\n";
		}
	}

	/* All attributes verified: else { varyin = 1 }
	 Close main body */
	stream << "    else\n"
		   << "    {\n"
		   << "        " << varying_name << " = 1;\n"
		   << "    }\n"
		   << "}\n\n";

	/* Store results */
	out_varying_name	   = varying_name;
	out_vertex_shader_code = stream.str();
}